

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListEnlarge(Parse *pParse,SrcList *pSrc,int nExtra,int iStart)

{
  sqlite3 *db_00;
  int in_ECX;
  int in_EDX;
  SrcList *in_RSI;
  Parse *in_RDI;
  sqlite3 *db;
  sqlite3_int64 nAlloc;
  SrcList *pNew;
  int i;
  u64 in_stack_ffffffffffffffb8;
  int local_24;
  SrcList *local_18;
  
  local_18 = in_RSI;
  if (in_RSI->nAlloc < (uint)(in_RSI->nSrc + in_EDX)) {
    db_00 = (sqlite3 *)((long)in_RSI->nSrc * 2 + (long)in_EDX);
    if (199 < in_RSI->nSrc + in_EDX) {
      sqlite3ErrorMsg(in_RDI,"too many FROM clause terms, max: %d",200);
      return (SrcList *)0x0;
    }
    if (200 < (long)db_00) {
      db_00 = (sqlite3 *)0xc8;
    }
    local_18 = (SrcList *)sqlite3DbRealloc(db_00,in_RDI->db,in_stack_ffffffffffffffb8);
    if (local_18 == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    local_18->nAlloc = (u32)db_00;
  }
  local_24 = local_18->nSrc;
  while (local_24 = local_24 + -1, in_ECX <= local_24) {
    memcpy(local_18->a + (local_24 + in_EDX),local_18->a + local_24,0x48);
  }
  local_18->nSrc = in_EDX + local_18->nSrc;
  memset(local_18->a + in_ECX,0,(long)in_EDX * 0x48);
  for (local_24 = in_ECX; local_24 < in_ECX + in_EDX; local_24 = local_24 + 1) {
    local_18->a[local_24].iCursor = -1;
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  Parse *pParse,     /* Parsing context into which errors are reported */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    sqlite3_int64 nAlloc = 2*(sqlite3_int64)pSrc->nSrc+nExtra;
    sqlite3 *db = pParse->db;

    if( pSrc->nSrc+nExtra>=SQLITE_MAX_SRCLIST ){
      sqlite3ErrorMsg(pParse, "too many FROM clause terms, max: %d",
                      SQLITE_MAX_SRCLIST);
      return 0;
    }
    if( nAlloc>SQLITE_MAX_SRCLIST ) nAlloc = SQLITE_MAX_SRCLIST;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return 0;
    }
    pSrc = pNew;
    pSrc->nAlloc = nAlloc;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}